

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall OSTEI_HRR_Algorithm_Base::Create(OSTEI_HRR_Algorithm_Base *this,QAM *am)

{
  initializer_list<QAM> __l;
  allocator_type local_72;
  less<QAM> local_71;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_70;
  undefined1 local_40 [48];
  
  QAM::QAM((QAM *)local_40,am);
  __l._M_len = 1;
  __l._M_array = (QAM *)local_40;
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_70,__l,&local_71,&local_72);
  Create(this,(set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_70);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_70);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(QAM am)
{
    Create(std::set<QAM>{am});
}